

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  size_t sVar1;
  Node *pNVar2;
  long lVar3;
  unsigned_long *puVar4;
  Node *pNVar5;
  void *pvVar6;
  ulong *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  Tree *in_RDI;
  size_t i;
  uint8_t *pData;
  size_t pCount;
  size_t diff;
  size_t gapLength;
  size_t gapOffset;
  Gap *gap;
  size_t gapIndex;
  size_t offset;
  Node *node;
  size_t treeIndex;
  Node *node_2;
  Node *node_1;
  size_t remainingBytes;
  uint8_t *ptr;
  size_t remainingBytes_1;
  uint8_t *ptr_1;
  char *in_stack_00000220;
  int in_stack_0000022c;
  char *in_stack_00000230;
  void *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe48;
  ulong uVar7;
  ConstPool *in_stack_fffffffffffffe50;
  ulong local_1a8;
  size_t *in_stack_fffffffffffffe78;
  Zone *this_00;
  ulong local_178;
  Zone *local_168;
  ulong local_158;
  void *local_150;
  Error local_13c;
  size_t *local_130;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  size_t local_108;
  Node *local_100;
  byte local_f1;
  long local_f0;
  ulong local_e8;
  void *local_e0;
  Node *local_d8;
  Node *local_d0;
  Node *local_c8;
  Node *local_c0;
  byte local_b1;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  Node *local_98;
  Node *local_90;
  Node *local_88;
  ulong local_80;
  Node *local_78;
  ulong local_70;
  Node *local_68;
  ulong local_60;
  Node *local_58;
  Node *local_50;
  ulong local_48;
  Node *local_40;
  ulong local_38;
  Node *local_30;
  ulong local_28;
  Node *local_20;
  Node *local_18;
  ulong local_10;
  size_t local_8;
  
  if (in_RDX == 0x20) {
    local_168 = (Zone *)0x5;
  }
  else if (in_RDX == 0x10) {
    local_168 = (Zone *)0x4;
  }
  else if (in_RDX == 8) {
    local_168 = (Zone *)0x3;
  }
  else if (in_RDX == 4) {
    local_168 = (Zone *)0x2;
  }
  else if (in_RDX == 2) {
    local_168 = (Zone *)0x1;
  }
  else {
    if (in_RDX != 1) {
      return 3;
    }
    local_168 = (Zone *)0x0;
  }
  local_158 = in_RDX;
  local_150 = in_RSI;
  pNVar2 = Tree::get(in_RDI,in_stack_fffffffffffffe38);
  if (pNVar2 == (Node *)0x0) {
    local_178 = 0xffffffffffffffff;
    for (this_00 = local_168; this_00 != (Zone *)0x5; this_00 = (Zone *)((long)&this_00->_ptr + 1))
    {
      in_stack_fffffffffffffe78 = (size_t *)(&in_RDI[6]._length)[(long)local_168];
      if (in_stack_fffffffffffffe78 != (size_t *)0x0) {
        local_178 = in_stack_fffffffffffffe78[1];
        sVar1 = in_stack_fffffffffffffe78[2];
        (&in_RDI[6]._length)[(long)local_168] = *in_stack_fffffffffffffe78;
        *in_stack_fffffffffffffe78 = in_RDI[8]._length;
        in_RDI[8]._length = (size_t)in_stack_fffffffffffffe78;
        local_120 = local_158;
        local_130 = in_stack_fffffffffffffe78;
        local_118 = local_178;
        if (local_178 % local_158 != 0) {
          DebugUtils::assertionFailed(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
        }
        if (sVar1 != local_158) {
          ConstPool_addGap(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(size_t)in_RDI);
        }
      }
    }
    if (local_178 == 0xffffffffffffffff) {
      local_108 = in_RDI[8]._dataSize;
      local_110 = local_158;
      local_10 = local_158;
      lVar3 = (local_108 + (local_158 - 1) & (local_158 - 1 ^ 0xffffffffffffffff)) - local_108;
      local_8 = local_108;
      if (lVar3 != 0) {
        ConstPool_addGap(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(size_t)in_RDI);
        in_RDI[8]._dataSize = lVar3 + in_RDI[8]._dataSize;
      }
      local_178 = in_RDI[8]._dataSize;
      in_RDI[8]._dataSize = local_158 + in_RDI[8]._dataSize;
    }
    pNVar2 = in_RDI->_root;
    local_a0 = local_150;
    local_a8 = local_158;
    local_b0 = local_178;
    local_b1 = 0;
    local_80 = local_158 + 0x18;
    local_68 = pNVar2->_link[0];
    local_70 = (long)pNVar2->_link[1] - (long)local_68;
    local_98 = pNVar2;
    local_78 = pNVar2;
    local_60 = local_80;
    local_58 = pNVar2;
    if (local_70 < local_80) {
      local_50 = (Node *)Zone::_alloc(this_00,(size_t)in_stack_fffffffffffffe78);
    }
    else {
      pNVar2->_link[0] = (Node *)((long)pNVar2->_link[0][1]._link + local_158);
      local_50 = local_68;
      if (pNVar2->_link[1] < pNVar2->_link[0]) {
        DebugUtils::assertionFailed(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
      }
    }
    local_c0 = local_50;
    if (local_50 == (Node *)0x0) {
      local_90 = (Node *)0x0;
    }
    else {
      local_50->_link[0] = (Node *)0x0;
      local_50->_link[1] = (Node *)0x0;
      *(uint *)&local_50->field_0x10 = *(uint *)&local_50->field_0x10 & 0x80000000 | 1;
      *(uint *)&local_50->field_0x10 =
           *(uint *)&local_50->field_0x10 & 0x7fffffff | (uint)(local_b1 & 1) << 0x1f;
      local_50->_offset = (uint32_t)local_b0;
      local_88 = local_50;
      memcpy(local_50 + 1,local_a0,local_a8);
      local_90 = local_c0;
    }
    if (local_90 == (Node *)0x0) {
      local_13c = 1;
    }
    else {
      Tree::put((Tree *)offset,(Node *)gapIndex);
      puVar4 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 9),&local_158);
      in_RDI[9]._root = (Node *)*puVar4;
      *in_RCX = local_178;
      local_1a8 = 1;
      while (4 < local_158) {
        local_158 = local_158 >> 1;
        local_1a8 = local_1a8 << 1;
        if (local_168 == (Zone *)0x0) {
          DebugUtils::assertionFailed(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
        }
        local_168 = (Zone *)((long)&local_168[-1]._blockAlignmentShift + 3);
        pvVar6 = local_150;
        for (uVar7 = 0; uVar7 < local_1a8; uVar7 = uVar7 + 1) {
          pNVar5 = Tree::get(in_RDI,pNVar2);
          if (pNVar5 == (Node *)0x0) {
            local_d8 = in_RDI->_root;
            local_f0 = local_178 + uVar7 * local_158;
            local_e8 = local_158;
            local_f1 = 1;
            local_48 = local_158 + 0x18;
            local_30 = local_d8->_link[0];
            local_38 = (long)local_d8->_link[1] - (long)local_30;
            local_e0 = pvVar6;
            local_40 = local_d8;
            local_28 = local_48;
            local_20 = local_d8;
            if (local_38 < local_48) {
              pNVar5 = (Node *)Zone::_alloc(this_00,(size_t)in_stack_fffffffffffffe78);
            }
            else {
              local_d8->_link[0] = (Node *)((long)local_d8->_link[0][1]._link + local_158);
              pNVar5 = local_30;
              if (local_d8->_link[1] < local_d8->_link[0]) {
                DebugUtils::assertionFailed(in_stack_00000230,in_stack_0000022c,in_stack_00000220);
              }
            }
            local_18 = pNVar5;
            local_100 = local_18;
            if (local_18 == (Node *)0x0) {
              local_d0 = (Node *)0x0;
            }
            else {
              local_18->_link[0] = (Node *)0x0;
              local_18->_link[1] = (Node *)0x0;
              *(uint *)&local_18->field_0x10 = *(uint *)&local_18->field_0x10 & 0x80000000 | 1;
              *(uint *)&local_18->field_0x10 =
                   *(uint *)&local_18->field_0x10 & 0x7fffffff | (uint)(local_f1 & 1) << 0x1f;
              local_18->_offset = (uint32_t)local_f0;
              local_c8 = local_18;
              memcpy(local_18 + 1,local_e0,local_e8);
              local_d0 = local_100;
            }
            Tree::put((Tree *)offset,(Node *)gapIndex);
          }
          pvVar6 = (void *)(local_158 + (long)pvVar6);
        }
      }
      local_13c = 0;
    }
  }
  else {
    *in_RCX = (ulong)pNVar2->_offset;
    local_13c = 0;
  }
  return local_13c;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~static_cast<size_t>(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapLength = gap->_length;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Utils::isAligned<size_t>(offset, size));

      gapLength -= size;
      if (gapLength > 0)
        ConstPool_addGap(this, gapOffset, gapLength);
    }

    gapIndex++;
  }

  if (offset == ~static_cast<size_t>(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Utils::alignDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorNoHeapMemory);

  _tree[treeIndex].put(node);
  _alignment = std::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].put(node);
    }
  }

  return kErrorOk;
}